

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O3

int __thiscall CmdLineArgsParser::ParseInteger(CmdLineArgsParser *this)

{
  WCHAR WVar1;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  int iVar5;
  char16_t *pcVar6;
  int iVar7;
  LPWSTR pWVar8;
  LPWSTR pWVar9;
  
  pWVar8 = this->pszCurrentArg;
  WVar1 = *pWVar8;
  iVar5 = 1;
  pWVar9 = pWVar8;
  if (WVar1 == L'-') {
    pWVar9 = pWVar8 + 1;
    this->pszCurrentArg = pWVar9;
    WVar1 = pWVar8[1];
    iVar5 = -1;
  }
  if (9 < (ushort)(WVar1 + L'￐')) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar6 = L"Integer Expected";
    goto LAB_00351227;
  }
  iVar7 = 10;
  iVar3 = 0;
  pWVar8 = pWVar9;
  if (WVar1 == L'0') {
    this->pszCurrentArg = pWVar9 + 1;
    pWVar8 = pWVar9 + 1;
    if (pWVar9[1] != L'x') goto LAB_003511b8;
    pWVar8 = pWVar9 + 2;
    this->pszCurrentArg = pWVar8;
    iVar7 = 0x10;
    bVar2 = true;
  }
  else {
LAB_003511b8:
    bVar2 = false;
  }
  while( true ) {
    WVar1 = *pWVar8;
    if ((9 < (ushort)(WVar1 + L'￐')) &&
       (((ushort)WVar1 < 0x41 || !bVar2 || (0x46 < (ushort)WVar1 && 5 < (ushort)(WVar1 + L'ﾟ')))))
    {
      return iVar3 * iVar5;
    }
    iVar3 = iVar3 * iVar7 + (uint)(ushort)WVar1 + -0x30;
    if (iVar3 < 0) break;
    this->pszCurrentArg = pWVar8 + 1;
    pWVar8 = pWVar8 + 1;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar6 = L"Integer too large to parse";
LAB_00351227:
  *puVar4 = pcVar6;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

int
CmdLineArgsParser::ParseInteger()
{
    int result  = 0;
    int sign    = 1;

    if('-' == CurChar())
    {
        sign = -1;
        NextChar();
    }
    if(!IsDigit())
    {
        throw Exception(_u("Integer Expected"));
    }

    int base = 10;

    if ('0' == CurChar())
    {
        NextChar();
        if (CurChar() == 'x')
        {
            NextChar();
            base = 16;
        }
        // Should the else case be parse as octal?
    }

    while(IsDigit() || (base == 16 && IsHexDigit()))
    {
        int currentDigit = (int)(CurChar() - '0');
        if (currentDigit > 9)
        {
            Assert(base == 16);
            if (CurChar() < 'F')
            {
                currentDigit = 10 + (int)(CurChar() - 'A');
            }
            else
            {
                currentDigit = 10 + (int)(CurChar() - 'a');
            }

            Assert(currentDigit < 16);
        }

        result = result * base + (int)(CurChar() - '0');
        if(result < 0)
        {
            // overflow or underflow in case sign = -1
            throw Exception(_u("Integer too large to parse"));
        }

        NextChar();
    }

    return result * sign;
}